

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::ReadIntoBuffer(BamStandardIndex *this,uint *bytesRequested)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char **in_RSI;
  BamException *in_RDI;
  stringstream s;
  int64_t bytesRead;
  undefined4 in_stack_fffffffffffffdc0;
  string *where;
  allocator local_1f9;
  string local_1f8 [55];
  undefined1 local_1c1 [33];
  stringstream local_1a0 [16];
  ostream local_190 [368];
  uint *in_stack_ffffffffffffffe0;
  uint *in_stack_ffffffffffffffe8;
  
  CheckBufferSize(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar2 = (**(code **)(**(long **)&in_RDI[2].m_errorString + 0x28))
                    (*(long **)&in_RDI[2].m_errorString,in_RDI[2].m_errorString._M_string_length,
                     *(uint *)in_RSI);
  if (uVar2 != *(uint *)in_RSI) {
    where = (string *)local_1c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1c1 + 1),"",(allocator *)where);
    _Var1 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1a0,(string *)(local_1c1 + 1),_Var1);
    std::__cxx11::string::~string((string *)(local_1c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1c1);
    poVar3 = std::operator<<(local_190,"expected to read: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)in_RSI);
    poVar3 = std::operator<<(poVar3," bytes, ");
    poVar3 = std::operator<<(poVar3,"but instead read: ");
    std::ostream::operator<<(poVar3,uVar2);
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"BamStandardIndex::ReadIntoBuffer",&local_1f9);
    std::__cxx11::stringstream::str();
    BamException::BamException(in_RDI,where,(string *)CONCAT44(_Var1,in_stack_fffffffffffffdc0));
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::ReadIntoBuffer(const unsigned int& bytesRequested) {

    // ensure that our buffer is big enough for request
    BamStandardIndex::CheckBufferSize(m_resources.Buffer, m_bufferLength, bytesRequested);

    // read from BAI file stream
    const int64_t bytesRead = m_resources.Device->Read(m_resources.Buffer, bytesRequested);
    if ( bytesRead != (int64_t)bytesRequested ) {
        stringstream s("");
        s << "expected to read: " << bytesRequested << " bytes, "
          << "but instead read: " << bytesRead;
        throw BamException("BamStandardIndex::ReadIntoBuffer", s.str());
    }
}